

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSetPagerFlags(Btree *p,uint pgFlags)

{
  BtShared *pBVar1;
  BtShared *pBt;
  uint pgFlags_local;
  Btree *p_local;
  
  pBVar1 = p->pBt;
  sqlite3BtreeEnter(p);
  sqlite3PagerSetFlags(pBVar1->pPager,pgFlags);
  sqlite3BtreeLeave(p);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetPagerFlags(
  Btree *p,              /* The btree to set the safety level on */
  unsigned pgFlags       /* Various PAGER_* flags */
){
  BtShared *pBt = p->pBt;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  sqlite3PagerSetFlags(pBt->pPager, pgFlags);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}